

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleigh.cc
# Opt level: O1

int4 __thiscall Sleigh::oneInstruction(Sleigh *this,PcodeEmit *emit,Address *baseaddr)

{
  PcodeCacher *this_00;
  int iVar1;
  AddrSpace *pAVar2;
  ParserContext *this_01;
  ParserContext *this_02;
  uintb uVar3;
  LowlevelError *this_03;
  ulong uVar4;
  long lVar5;
  int4 iVar6;
  int iVar7;
  ostringstream s;
  SleighBuilder builder;
  ParserWalker walker;
  Address local_290 [23];
  SleighBuilder local_118;
  undefined1 local_d0 [160];
  
  uVar4 = (ulong)(this->super_SleighBase).super_Translate.alignment;
  if ((uVar4 != 1) && (baseaddr->offset % uVar4 != 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_290,"Instruction address not aligned: ",0x21);
    operator<<((ostream *)local_290,baseaddr);
    this_03 = (LowlevelError *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    LowlevelError::LowlevelError(this_03,(string *)local_d0);
    *(undefined4 *)&this_03[1].explain._M_dataplus._M_p = 0;
    __cxa_throw(this_03,&UnimplError::typeinfo,LowlevelError::~LowlevelError);
  }
  this_01 = obtainContext(this,baseaddr,2);
  ParserContext::applyCommits(this_01);
  iVar6 = this_01->base_state->length;
  if (0 < this_01->delayslot) {
    iVar7 = 0;
    do {
      local_290[0].base = (this_01->addr).base;
      local_290[0].offset = (long)iVar6 + (this_01->addr).offset;
      if ((local_290[0].base)->highest < local_290[0].offset) {
        uVar4 = (local_290[0].base)->highest + 1;
        lVar5 = (long)local_290[0].offset % (long)uVar4;
        local_290[0].offset = (lVar5 >> 0x3f & uVar4) + lVar5;
      }
      this_02 = obtainContext(this,local_290,2);
      ParserContext::applyCommits(this_02);
      iVar1 = this_02->base_state->length;
      iVar6 = iVar6 + iVar1;
      iVar7 = iVar7 + iVar1;
    } while (iVar7 < this_01->delayslot);
    pAVar2 = (this_01->addr).base;
    uVar3 = (long)iVar6 + (this_01->addr).offset;
    uVar4 = pAVar2->highest;
    if (uVar4 < uVar3) {
      uVar4 = uVar4 + 1;
      lVar5 = (long)uVar3 % (long)uVar4;
      uVar3 = (lVar5 >> 0x3f & uVar4) + lVar5;
    }
    (this_01->naddr).base = pAVar2;
    (this_01->naddr).offset = uVar3;
  }
  local_d0._8_8_ = (ParserContext *)0x0;
  local_d0._16_8_ = this_01->base_state;
  local_d0._24_4_ = 0;
  local_d0._28_4_ = 0;
  this_00 = &this->pcode_cache;
  local_d0._0_8_ = this_01;
  PcodeCacher::clear(this_00);
  SleighBuilder::SleighBuilder
            (&local_118,(ParserWalker *)local_d0,this->discache,this_00,
             (this->super_SleighBase).super_Translate.super_AddrSpaceManager.constantspace,
             (this->super_SleighBase).super_Translate.super_AddrSpaceManager.uniqspace,
             (this->super_SleighBase).unique_allocatemask);
  PcodeBuilder::build(&local_118.super_PcodeBuilder,
                      *(ConstructTpl **)(*(long *)local_d0._16_8_ + 0x60),-1);
  PcodeCacher::resolveRelatives(this_00);
  PcodeCacher::emit(this_00,baseaddr,emit);
  return iVar6;
}

Assistant:

int4 Sleigh::oneInstruction(PcodeEmit &emit,const Address &baseaddr) const

{
  int4 fallOffset;
  if (alignment != 1) {
    if ((baseaddr.getOffset() % alignment)!=0) {
      ostringstream s;
      s << "Instruction address not aligned: " << baseaddr;
      throw UnimplError(s.str(),0);
    }
  }
  
  ParserContext *pos = obtainContext(baseaddr,ParserContext::pcode);
  pos->applyCommits();
  fallOffset = pos->getLength();
  
  if (pos->getDelaySlot()>0) {
    int4 bytecount = 0;
    do {
    // Do not pass pos->getNaddr() to obtainContext, as pos may have been previously cached and had naddr adjusted
      ParserContext *delaypos = obtainContext(pos->getAddr() + fallOffset,ParserContext::pcode);
      delaypos->applyCommits();
      int4 len = delaypos->getLength();
      fallOffset += len;
      bytecount += len;
    } while(bytecount < pos->getDelaySlot());
    pos->setNaddr(pos->getAddr()+fallOffset);
  }
  ParserWalker walker(pos);
  walker.baseState();
  pcode_cache.clear();
  SleighBuilder builder(&walker,discache,&pcode_cache,getConstantSpace(),getUniqueSpace(),unique_allocatemask);
  try {
    builder.build(walker.getConstructor()->getTempl(),-1);
    pcode_cache.resolveRelatives();
    pcode_cache.emit(baseaddr,&emit);
  } catch(UnimplError &err) {
    ostringstream s;
    s << "Instruction not implemented in pcode:\n ";
    ParserWalker *cur = builder.getCurrentWalker();
    cur->baseState();
    Constructor *ct = cur->getConstructor();
    cur->getAddr().printRaw(s);
    s << ": ";
    ct->printMnemonic(s,*cur);
    s << "  ";
    ct->printBody(s,*cur);
    err.explain = s.str();
    err.instruction_length = fallOffset;
    throw err;
  }
  return fallOffset;
}